

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O1

void hit(char *str,boolean silently,monst *mtmp,char *force)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  obj *poVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  
  if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
    if (mtmp->wormno == '\0') {
      if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
         ((((u.uprops[0x1e].intrinsic == 0 &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
          (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
            (((youmonst.data)->mflags3 & 0x100) != 0)) &&
           (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 && ((mtmp->data->mflags3 & 0x200) != 0)))))))
         ) goto LAB_0028f117;
    }
    else {
      bVar2 = worm_known(level,mtmp);
      if (bVar2 != '\0') {
LAB_0028f117:
        uVar1 = *(uint *)&mtmp->field_0x60;
        if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          if ((uVar1 & 0x280) == 0) goto LAB_0028f160;
        }
        else if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0028f160:
          if ((u._1052_1_ & 0x20) == 0) goto LAB_0028f2de;
        }
      }
    }
    if (((mtmp->data->mflags1 & 0x10000) == 0) &&
       ((poVar4 = which_armor(mtmp,4), poVar4 == (obj *)0x0 ||
        (poVar4 = which_armor(mtmp,4), poVar4->otyp != 0x4f)))) {
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
          ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
            (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
            youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) {
        if ((u.uprops[0x19].extrinsic == 0) || (u.uprops[0x19].blocked != 0)) goto LAB_0028f2b0;
        iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
        if ((iVar3 < 0x41) || (u.uprops[0x42].intrinsic != 0)) goto LAB_0028f2de;
        goto LAB_0028f2c0;
      }
    }
    else {
LAB_0028f2b0:
      if (u.uprops[0x42].intrinsic == 0) {
LAB_0028f2c0:
        if (((u.uprops[0x42].extrinsic == 0) && (bVar2 = match_warn_of_mon(mtmp), bVar2 == '\0')) &&
           (((u._1052_1_ & 1) == 0 || (u.ustuck != mtmp)))) goto LAB_0028f35b;
      }
    }
  }
LAB_0028f2de:
  if (flags.verbose != '\0') {
    pcVar5 = The(str);
    pcVar8 = "silently ";
    if (silently == '\0') {
      pcVar8 = "";
    }
    pcVar6 = vtense(str,"hit");
    pcVar7 = mon_nam(mtmp);
    pline("%s %s%s %s%s",pcVar5,pcVar8,pcVar6,pcVar7,force);
    return;
  }
LAB_0028f35b:
  pcVar5 = The(str);
  pcVar8 = vtense(str,"hit");
  pline("%s %s it.",pcVar5,pcVar8);
  return;
}

Assistant:

void hit(const char *str, boolean silently, struct monst *mtmp,
	 const char *force)	/* usually either "." or "!" */
{
	if ((!cansee(bhitpos.x,bhitpos.y) && !canspotmon(level, mtmp) &&
	     !(u.uswallow && mtmp == u.ustuck))
	   || !flags.verbose)
	    pline("%s %s it.", The(str), vtense(str, "hit"));
	else pline("%s %s%s %s%s",
		   The(str), (silently ? "silently ": ""), vtense(str, "hit"),
		   mon_nam(mtmp), force);
}